

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLin>
                 *this,GetterXsYs<double> *getter1,GetterXsYRef<double> *getter2,
                TransformerLogLin *transformer,ImU32 col)

{
  TransformerLogLin *this_00;
  ImVec2 IVar1;
  int iVar2;
  ImPlotPoint IVar3;
  ImPlotPoint local_28;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter2->Count;
  if (getter1->Count < getter2->Count) {
    iVar2 = getter1->Count;
  }
  this->Prims = iVar2 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  (this->P12).y = 0.0;
  IVar3 = GetterXsYs<double>::operator()(getter1,0);
  local_28.y = IVar3.y;
  local_28.x = IVar3.x;
  IVar1 = TransformerLogLin::operator()(transformer,&local_28);
  this->P11 = IVar1;
  this_00 = this->Transformer;
  IVar3 = GetterXsYRef<double>::operator()(this->Getter2,0);
  local_28.y = IVar3.y;
  local_28.x = IVar3.x;
  IVar1 = TransformerLogLin::operator()(this_00,&local_28);
  this->P12 = IVar1;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }